

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::transfer_conserve_motion
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Graph *keys2elems,
               LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  LOs same_ents2old_ents_00;
  LOs same_ents2new_ents_00;
  undefined1 auVar1 [12];
  bool bVar2;
  LOs prods2new_ents;
  LOs keys2prods;
  Cavs init_cavs;
  Graph bdry_keys2doms;
  CavsByBdryStatus cavs;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 uVar3;
  undefined4 uStack_26c;
  Write<int> local_268;
  undefined1 local_258 [32];
  Write<int> local_238;
  Write<int> local_228;
  Write<int> local_218;
  Write<int> local_208;
  Write<int> local_1f8;
  Write<int> local_1e8;
  Write<int> local_1d8;
  Write<int> local_1c8;
  Write<int> local_1b8;
  Cavs local_1a8;
  Graph local_168;
  Cavs local_148;
  
  uVar3 = SUB84(same_ents2old_ents,0);
  uStack_26c = (undefined4)((ulong)same_ents2old_ents >> 0x20);
  bVar2 = should_conserve_any(old_mesh,opts);
  if (bVar2) {
    Write<int>::Write(&local_1c8,(Write<int> *)keys2elems);
    Write<int>::Write(&local_1d8,&(keys2elems->ab2b).write_);
    Write<int>::Write(&local_1e8,&keys2verts->write_);
    Write<int>::Write(&local_1f8,&local_1c8);
    Write<int>::Write(&local_1b8,&local_1d8);
    form_initial_cavs(&local_1a8,old_mesh,new_mesh,0,(LOs *)&local_1e8,(LOs *)&local_1f8,
                      (LOs *)&local_1b8);
    Write<int>::~Write(&local_1b8);
    Write<int>::~Write(&local_1f8);
    Write<int>::~Write(&local_1e8);
    Write<int>::Write(&local_208,(Write<int> *)&local_1a8);
    Write<int>::Write(&local_218,(Write<int> *)&local_1a8.keys2new_elems);
    bVar2 = operator==((Read<int> *)&local_208,(Read<int> *)&local_218);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21b);
    }
    Write<int>::~Write(&local_218);
    Write<int>::~Write(&local_208);
    Write<int>::Write(&local_228,&local_1a8.keys2old_elems.ab2b.write_);
    Write<int>::Write(&local_238,&local_1a8.keys2new_elems.ab2b.write_);
    bVar2 = operator==((Read<int> *)&local_228,(Read<int> *)&local_238);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21c);
    }
    Write<int>::~Write(&local_238);
    Write<int>::~Write(&local_228);
    Graph::Graph(&local_168,keys2elems);
    Cavs::Cavs(&local_148,&local_1a8);
    Write<int>::Write((Write<int> *)(local_258 + 0x10),&keys2verts->write_);
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_148,0,
                      (LOs *)(local_258 + 0x10),&local_168);
    Write<int>::~Write((Write<int> *)(local_258 + 0x10));
    Cavs::~Cavs(&local_148);
    Write<int>::Write((Write<int> *)local_258,(Write<int> *)CONCAT44(uStack_26c,uVar3));
    Write<int>::Write(&local_268,&same_ents2new_ents->write_);
    same_ents2old_ents_00.write_.shared_alloc_.direct_ptr._4_4_ = in_stack_fffffffffffffd74;
    same_ents2old_ents_00.write_.shared_alloc_._0_12_ = ZEXT812(0x1000101);
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr._0_4_ = 0x1000101;
    same_ents2new_ents_00.write_.shared_alloc_.alloc = (Alloc *)in_stack_fffffffffffffd78;
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr._4_4_ = 0;
    auVar1._4_4_ = uVar3;
    auVar1._0_4_ = in_stack_fffffffffffffd8c;
    auVar1._8_4_ = 0;
    transfer_conservation_errors
              ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,
               (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_258,same_ents2old_ents_00,
               same_ents2new_ents_00,(OpConservation)(auVar1 << 0x20));
    Write<int>::~Write(&local_268);
    Write<int>::~Write((Write<int> *)local_258);
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
            *)&stack0xfffffffffffffef8);
    Graph::~Graph(&local_168);
    Cavs::~Cavs(&local_1a8);
    Write<int>::~Write(&local_1d8);
    Write<int>::~Write(&local_1c8);
  }
  return;
}

Assistant:

void transfer_conserve_motion(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2verts, Graph keys2elems, LOs same_ents2old_ents,
    LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto keys2prods = keys2elems.a2ab;
  auto prods2new_ents = keys2elems.ab2b;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b);
  auto bdry_keys2doms = keys2elems;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}